

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3LcsIteratorAdvance(LcsIterator *pIter)

{
  int iVar1;
  int local_24;
  long lStack_20;
  int rc;
  sqlite3_int64 iRead;
  char *pRead;
  LcsIterator *pIter_local;
  
  iRead = (sqlite3_int64)pIter->pRead;
  local_24 = 0;
  pRead = (char *)pIter;
  iVar1 = sqlite3Fts3GetVarint((char *)iRead,&stack0xffffffffffffffe0);
  iRead = iRead + iVar1;
  if ((lStack_20 == 0) || (lStack_20 == 1)) {
    iRead = 0;
    local_24 = 1;
  }
  else {
    *(int *)(pRead + 0x18) = (int)lStack_20 + -2 + *(int *)(pRead + 0x18);
  }
  *(sqlite3_int64 *)(pRead + 0x10) = iRead;
  return local_24;
}

Assistant:

static int fts3LcsIteratorAdvance(LcsIterator *pIter){
  char *pRead = pIter->pRead;
  sqlite3_int64 iRead;
  int rc = 0;

  pRead += sqlite3Fts3GetVarint(pRead, &iRead);
  if( iRead==0 || iRead==1 ){
    pRead = 0;
    rc = 1;
  }else{
    pIter->iPos += (int)(iRead-2);
  }

  pIter->pRead = pRead;
  return rc;
}